

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int8_t __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
::quantize_gradient_org
          (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
           *this,int32_t di)

{
  int iVar1;
  int32_t di_local;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
  *this_local;
  
  iVar1 = -this->t3_;
  if (di == iVar1 || SBORROW4(di,iVar1) != di + this->t3_ < 0) {
    this_local._7_1_ = -4;
  }
  else if (-this->t2_ < di) {
    if (-this->t1_ < di) {
      if (di < -(this->traits_).near_lossless) {
        this_local._7_1_ = -1;
      }
      else if ((this->traits_).near_lossless < di) {
        if (di < this->t1_) {
          this_local._7_1_ = '\x01';
        }
        else if (di < this->t2_) {
          this_local._7_1_ = '\x02';
        }
        else if (di < this->t3_) {
          this_local._7_1_ = '\x03';
        }
        else {
          this_local._7_1_ = '\x04';
        }
      }
      else {
        this_local._7_1_ = '\0';
      }
    }
    else {
      this_local._7_1_ = -2;
    }
  }
  else {
    this_local._7_1_ = -3;
  }
  return this_local._7_1_;
}

Assistant:

int8_t quantize_gradient_org(const int32_t di) const noexcept
    {
        if (di <= -t3_)
            return -4;
        if (di <= -t2_)
            return -3;
        if (di <= -t1_)
            return -2;
        if (di < -traits_.near_lossless)
            return -1;
        if (di <= traits_.near_lossless)
            return 0;
        if (di < t1_)
            return 1;
        if (di < t2_)
            return 2;
        if (di < t3_)
            return 3;

        return 4;
    }